

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *in_RAX;
  long lVar3;
  ulong uVar4;
  char **basename;
  long lVar5;
  uint uVar6;
  BigBlock BStack_90;
  ulong uStack_38;
  code *pcStack_30;
  BigFile local_28;
  BigFile bf;
  
  uVar4 = (ulong)(uint)argc;
  local_28.basename = in_RAX;
  while( true ) {
    pcStack_30 = (code *)0x10262e;
    basename = argv;
    iVar1 = getopt(argc,argv,"l");
    if (iVar1 != 0x6c) break;
    longfmt = 1;
  }
  if ((iVar1 == -1) && (_optind < argc)) {
    argv = argv + _optind;
    uVar4 = (ulong)(uint)(argc - _optind);
    if (argc - _optind == 1) {
      pcStack_30 = (code *)0x102665;
      listbigfile(((BigFile *)argv)->basename);
    }
    else {
      local_28.basename = (char *)0x0;
      basename = (char **)((BigFile *)argv)->basename;
      pcStack_30 = (code *)0x10267a;
      iVar1 = big_file_open(&local_28,(char *)basename);
      if (iVar1 != 0) goto LAB_001026b1;
      pcStack_30 = (code *)0x10268b;
      iVar1 = listbigblock(&local_28,((BigFile *)argv)[1].basename);
      if (iVar1 != 0) {
        pcStack_30 = (code *)0x1026aa;
        main_cold_2();
      }
      pcStack_30 = (code *)0x102698;
      big_file_close(&local_28);
    }
    return 0;
  }
  pcStack_30 = (code *)0x1026b1;
  usage();
LAB_001026b1:
  pcStack_30 = listbigblock;
  main_cold_1();
  BStack_90.attrset = (BigAttrSet *)0x0;
  BStack_90.dirty = 0;
  BStack_90._76_4_ = 0;
  BStack_90.fchecksum = (uint *)0x0;
  BStack_90.Nfile = 0;
  BStack_90._60_4_ = 0;
  BStack_90.fsize = (size_t *)0x0;
  BStack_90.foffset = (size_t *)0x0;
  BStack_90.basename = (char *)0x0;
  BStack_90.size = 0;
  BStack_90.dtype[0] = '\0';
  BStack_90.dtype[1] = '\0';
  BStack_90.dtype[2] = '\0';
  BStack_90.dtype[3] = '\0';
  BStack_90.dtype[4] = '\0';
  BStack_90.dtype[5] = '\0';
  BStack_90.dtype[6] = '\0';
  BStack_90.dtype[7] = '\0';
  BStack_90._8_8_ = 0;
  uStack_38 = uVar4;
  pcStack_30 = (code *)&stack0xfffffffffffffff8;
  iVar1 = big_file_open_block((BigFile *)argv,&BStack_90,(char *)basename);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (longfmt == 0) {
      fprintf(_stdout,"%s\n",basename);
    }
    else {
      lVar5 = (long)BStack_90.Nfile;
      if (lVar5 < 1) {
        uVar6 = 0;
      }
      else {
        lVar3 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + BStack_90.fchecksum[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar5 != lVar3);
      }
      uVar6 = (uVar6 >> 0x10) + (uVar6 & 0xffff);
      fprintf(_stdout,"%-28s %s %d %12td %05u %d %s\n",basename,&BStack_90,
              BStack_90._8_8_ & 0xffffffff,BStack_90.size,
              (ulong)((uVar6 >> 0x10) + (uVar6 & 0xffff)),lVar5,BStack_90.basename);
    }
    big_block_close(&BStack_90);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char * argv[]) {
    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt){
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind < 1) {
        usage();
    }
    argv += optind - 1;
    if(argc - optind == 1) {
        listbigfile(argv[1]);
    } else {
        BigFile bf = {0};
        if(0 != big_file_open(&bf, argv[1])) {
            fprintf(stderr, "failed to open: %s : %s\n", argv[1], big_file_get_error_message());
            exit(1);
        }
        if(0 != listbigblock(&bf, argv[2])) {
            fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        }
        big_file_close(&bf);
    }
    return 0;
}